

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O0

void __thiscall
CTestResource_TestPlanar2D_MFX_JPEG_YUV411R_Test::TestBody
          (CTestResource_TestPlanar2D_MFX_JPEG_YUV411R_Test *this)

{
  uint32_t uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AssertHelper local_208;
  Message local_200;
  unsigned_long local_1f8;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_5;
  Message local_1d0;
  undefined8 local_1c8;
  undefined4 local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_4;
  Message local_1a0;
  unsigned_long local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_3;
  Message local_178;
  undefined8 local_170;
  undefined4 local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_2;
  Message local_148;
  undefined8 local_140;
  undefined4 local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  Message local_118 [3];
  undefined8 local_100;
  undefined4 local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  int local_d8;
  uint32_t Size;
  uint32_t VHeight;
  uint32_t YHeight;
  uint32_t Height;
  uint32_t Pitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESCREATE_PARAMS gmmParams;
  TEST_TILE_TYPE Tile;
  uint32_t TileIndex;
  uint32_t TileSize [3] [2];
  uint32_t PlaneRowAlignment;
  TEST_TILE_TYPE TileTypes [3];
  CTestResource_TestPlanar2D_MFX_JPEG_YUV411R_Test *this_local;
  
  stack0xffffffffffffffe4 = 0x100000000;
  TileSize[2][0] = 0x10;
  _Tile = 0x100000001;
  TileSize[0][0] = 0x200;
  TileSize[0][1] = 8;
  TileSize[1][0] = 0x80;
  TileSize[1][1] = 0x20;
  for (gmmParams.MultiTileArch.Reserved = 0; gmmParams.MultiTileArch.Reserved < 3;
      gmmParams.MultiTileArch.Reserved = gmmParams.MultiTileArch.Reserved + 1) {
    gmmParams.MultiTileArch._0_4_ = TileSize[2][(ulong)gmmParams.MultiTileArch.Reserved + 1];
    memset(&ResourceInfo,0,0x80);
    ResourceInfo._0_4_ = 2;
    gmmParams.ExistingSysMemSize._4_1_ = 1;
    gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
    gmmParams.CpTag = 0x101;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 0x101;
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    CTestResource::SetTileFlag
              (&this->super_CTestResource,(GMM_RESCREATE_PARAMS *)&ResourceInfo,
               gmmParams.MultiTileArch._0_4_);
    ResourceInfo._4_4_ = 0x157;
    _Height = (GMM_RESOURCE_INFO *)
              (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                        (CommonULT::pGmmULTClientContext,&ResourceInfo);
    uVar1 = gmmParams.CpTag;
    if (gmmParams.MultiTileArch._0_4_ == 0) {
      YHeight = (uVar1 + 0x3f) - (uVar1 + 0x3f & 0x3f);
      Size = (gmmParams.field_6.BaseWidth + 0xf) - (gmmParams.field_6.BaseWidth + 0xf & 0xf);
      local_d8 = (((gmmParams.field_6.BaseWidth + 3) - (gmmParams.field_6.BaseWidth + 3 & 3) >> 2) +
                 0xf) - (((gmmParams.field_6.BaseWidth + 3) - (gmmParams.field_6.BaseWidth + 3 & 3)
                         >> 2) + 0xf & 0xf);
    }
    else {
      YHeight = (uVar1 + ((&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX)) -
                (uVar1 + ((&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX) &
                (&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2] - TEST_TILEX);
      iVar3 = (gmmParams.field_6.BaseWidth + 0xf) - (gmmParams.field_6.BaseWidth + 0xf & 0xf);
      Size = (iVar3 + (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1)) -
             (iVar3 + (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1) &
             TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1);
      iVar3 = (((gmmParams.field_6.BaseWidth + 3) - (gmmParams.field_6.BaseWidth + 3 & 3) >> 2) +
              0xf) - (((gmmParams.field_6.BaseWidth + 3) - (gmmParams.field_6.BaseWidth + 3 & 3) >>
                      2) + 0xf & 0xf);
      local_d8 = (iVar3 + (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1)) -
                 (iVar3 + (TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1) &
                 TileSize[(ulong)gmmParams.MultiTileArch.Reserved - 1][1] - 1);
    }
    VHeight = Size + local_d8 * 2;
    gtest_ar.message_.ptr_._4_4_ = (YHeight * VHeight + 0xfff) - (YHeight * VHeight + 0xfff & 0xfff)
    ;
    CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,_Height,YHeight);
    if (gmmParams.MultiTileArch._0_4_ != 0) {
      CTestResource::VerifyResourcePitchInTiles<true>
                (&this->super_CTestResource,_Height,
                 YHeight / (&Tile)[(ulong)gmmParams.MultiTileArch.Reserved * 2]);
    }
    CTestResource::VerifyResourceSize<true>
              (&this->super_CTestResource,_Height,(ulong)gtest_ar.message_.ptr_._4_4_);
    CTestResource::VerifyResourceHAlign<false>(&this->super_CTestResource,_Height,0);
    CTestResource::VerifyResourceVAlign<false>(&this->super_CTestResource,_Height,0);
    CTestResource::VerifyResourceQPitch<false>(&this->super_CTestResource,_Height,0);
    local_f4 = 0;
    local_100 = (**(code **)(*(long *)_Height + 0x210))(_Height,1);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_f0,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",
               (unsigned_long *)&local_f4,&local_100);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
    if (!bVar2) {
      testing::Message::Message(local_118);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc4e,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_118);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
    local_134 = 0;
    local_140 = (**(code **)(*(long *)_Height + 0x218))(_Height,1);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_130,"0",(int *)"ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",
               (unsigned_long *)&local_134,&local_140);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar2) {
      testing::Message::Message(&local_148);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc4f,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_148);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    local_164 = 0;
    local_170 = (**(code **)(*(long *)_Height + 0x210))(_Height,2);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_160,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",
               (unsigned_long *)&local_164,&local_170);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
    if (!bVar2) {
      testing::Message::Message(&local_178);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc52,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_178);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
    local_198 = (**(code **)(*(long *)_Height + 0x218))(_Height,2);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_190,"YHeight","ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",
               &Size,&local_198);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar2) {
      testing::Message::Message(&local_1a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc53,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    local_1bc = 0;
    local_1c8 = (**(code **)(*(long *)_Height + 0x210))(_Height,3);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              ((char *)local_1b8,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",
               (unsigned_long *)&local_1bc,&local_1c8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
    if (!bVar2) {
      testing::Message::Message(&local_1d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc56,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_1d0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
    local_1ec = Size + local_d8;
    local_1f8 = (**(code **)(*(long *)_Height + 0x218))(_Height,3);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_1e8,"YHeight + VHeight",
               "ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",&local_1ec,&local_1f8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar2) {
      testing::Message::Message(&local_200);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
                 ,0xc57,pcVar4);
      testing::internal::AssertHelper::operator=(&local_208,&local_200);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      testing::Message::~Message(&local_200);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))();
  }
  return;
}

Assistant:

TEST_F(CTestResource, TestPlanar2D_MFX_JPEG_YUV411R)
{
    /* Test planar surfaces where both U and V are quarter the size of Y */
    //YYYYYYYY
    //YYYYYYYY
    //YYYYYYYY
    //YYYYYYYY
    //UUUUUUUU
    //VVVVVVVV
    const TEST_TILE_TYPE TileTypes[]       = {TEST_LINEAR, TEST_TILEX, TEST_TILEY};
    const uint32_t       PlaneRowAlignment = 16;

    const uint32_t TileSize[3][2] = {{1, 1},     //Linear
                                     {512, 8},   // TileX
                                     {128, 32}}; // TileY
    for(uint32_t TileIndex = 0; TileIndex < sizeof(TileTypes) / sizeof(TileTypes[0]); TileIndex++)
    {
        TEST_TILE_TYPE Tile = TileTypes[TileIndex];

        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Type                 = RESOURCE_2D;
        gmmParams.NoGfxMemory          = 1;
        gmmParams.Flags.Gpu.Texture    = 1;
        gmmParams.BaseWidth64          = 0x101;
        gmmParams.BaseHeight           = 0x101;
        gmmParams.Depth                = 0x1;
        SetTileFlag(gmmParams, static_cast<TEST_TILE_TYPE>(Tile));
        gmmParams.Format = GMM_FORMAT_MFX_JPEG_YUV411R_TYPE;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t Pitch, Height;
        uint32_t YHeight, VHeight;
        if(Tile != TEST_LINEAR)
        {
            Pitch   = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[TileIndex][0]);
            YHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, PlaneRowAlignment);
            YHeight = GMM_ULT_ALIGN(YHeight, TileSize[TileIndex][1]);

            VHeight = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseHeight, 4) / 4, PlaneRowAlignment);
            VHeight = GMM_ULT_ALIGN(VHeight, TileSize[TileIndex][1]);
        }
        else
        {
            Pitch   = GMM_ULT_ALIGN(gmmParams.BaseWidth64, GMM_BYTES(64));
            YHeight = GMM_ULT_ALIGN(gmmParams.BaseHeight, PlaneRowAlignment);
            VHeight = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseHeight, 4) / 4, PlaneRowAlignment);
        }

        Height        = YHeight + 2 * VHeight;
        uint32_t Size = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

        VerifyResourcePitch<true>(ResourceInfo, Pitch);
        if(Tile != TEST_LINEAR)
        {
            VerifyResourcePitchInTiles<true>(ResourceInfo, Pitch / TileSize[TileIndex][0]);
        }
        VerifyResourceSize<true>(ResourceInfo, Size);
        VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

        // Y plane should be at 0,0
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
        EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

        // U plane should be at end of Y plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
        EXPECT_EQ(YHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));

        // V plane should be at end of U plane
        EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));
        EXPECT_EQ(YHeight + VHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}